

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O2

bool __thiscall
LoopCrosser::CellCrossesAnySubcell(LoopCrosser *this,S2ClippedShape *a_clipped,S2CellId b_id)

{
  int i_00;
  pointer ppSVar1;
  bool bVar2;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar3;
  S2Point *a0;
  S2Point *a1;
  const_reference b_clipped;
  ulong uVar4;
  int i;
  ulong uVar5;
  pointer ppSVar6;
  vector<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_> *__range2;
  S2PaddedCell b_root;
  S2PaddedCell local_90;
  
  S2PaddedCell::S2PaddedCell(&local_90,b_id,0.0);
  uVar4 = (ulong)(*(uint *)&a_clipped->field_0x4 >> 1);
  for (uVar5 = 0; uVar5 != uVar4; uVar5 = uVar5 + 1) {
    paVar3 = &a_clipped->field_3;
    if (5 < *(uint *)&a_clipped->field_0x4) {
      paVar3 = (anon_union_8_2_2d159a09_for_S2ClippedShape_3 *)(a_clipped->field_3).edges_;
    }
    i_00 = *(int *)((long)paVar3 + uVar5 * 4);
    a0 = S2Loop::vertex(this->a_,i_00);
    a1 = S2Loop::vertex(this->a_,i_00 + 1);
    S2CrossingEdgeQuery::GetCells(&this->b_query_,a0,a1,&local_90,&this->b_cells_);
    if ((this->b_cells_).
        super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (this->b_cells_).
        super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      StartEdge(this,i_00);
      ppSVar6 = (this->b_cells_).
                super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppSVar1 = (this->b_cells_).
                super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      while (ppSVar6 != ppSVar1) {
        b_clipped = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::
                    operator[]((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>
                                *)*ppSVar6,0);
        bVar2 = EdgeCrossesCell(this,b_clipped);
        ppSVar6 = ppSVar6 + 1;
        if (bVar2) goto LAB_0023c8ed;
      }
    }
  }
LAB_0023c8ed:
  return uVar5 < uVar4;
}

Assistant:

bool LoopCrosser::CellCrossesAnySubcell(const S2ClippedShape& a_clipped,
                                        S2CellId b_id) {
  // Test all edges of "a_clipped" against all edges of B.  The relevant B
  // edges are guaranteed to be children of "b_id", which lets us find the
  // correct index cells more efficiently.
  S2PaddedCell b_root(b_id, 0);
  int a_num_edges = a_clipped.num_edges();
  for (int i = 0; i < a_num_edges; ++i) {
    int aj = a_clipped.edge(i);
    // Use an S2CrossingEdgeQuery starting at "b_root" to find the index cells
    // of B that might contain crossing edges.
    b_query_.GetCells(a_.vertex(aj), a_.vertex(aj+1), b_root, &b_cells_);
    if (b_cells_.empty()) continue;
    StartEdge(aj);
    for (const S2ShapeIndexCell* b_cell : b_cells_) {
      if (EdgeCrossesCell(b_cell->clipped(0))) return true;
    }
  }
  return false;
}